

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void start_pass_main(j_compress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_c_main_controller *pjVar1;
  my_main_ptr_conflict main;
  J_BUF_MODE pass_mode_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->main;
  if (cinfo->raw_data_in == 0) {
    *(undefined4 *)&pjVar1[1].start_pass = 0;
    *(undefined4 *)((long)&pjVar1[1].start_pass + 4) = 0;
    *(undefined4 *)&pjVar1[1].process_data = 0;
    *(J_BUF_MODE *)((long)&pjVar1[1].process_data + 4) = pass_mode;
    if (pass_mode == JBUF_PASS_THRU) {
      pjVar1->process_data = process_data_simple_main;
    }
    else {
      cinfo->err->msg_code = 3;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_main (j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->upsample->need_context_rows) {
      main->pub.process_data = process_data_context_main;
      make_funny_pointers(cinfo); /* Create the xbuffer[] lists */
      main->whichptr = 0;	/* Read first iMCU row into xbuffer[0] */
      main->context_state = CTX_PREPARE_FOR_IMCU;
      main->iMCU_row_ctr = 0;
    } else {
      /* Simple case with no context needed */
      main->pub.process_data = process_data_simple_main;
    }
    main->buffer_full = FALSE;	/* Mark buffer empty */
    main->rowgroup_ctr = 0;
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_CRANK_DEST:
    /* For last pass of 2-pass quantization, just crank the postprocessor */
    main->pub.process_data = process_data_crank_post;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
}